

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicHeap.hpp
# Opt level: O0

void __thiscall
Diligent::DynamicHeap::MasterBlockListBasedManager::~MasterBlockListBasedManager
          (MasterBlockListBasedManager *this)

{
  __int_type_conflict _Var1;
  Char *Message;
  char (*in_RCX) [55];
  undefined1 local_30 [8];
  string msg;
  MasterBlockListBasedManager *this_local;
  
  msg.field_2._8_8_ = this;
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->m_MasterBlockCounter);
  if (_Var1 != 0) {
    FormatString<std::atomic<int>,char[55]>
              ((string *)local_30,(Diligent *)&this->m_MasterBlockCounter,
               (atomic<int> *)" master block(s) have not been returned to the manager",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~MasterBlockListBasedManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/DynamicHeap.hpp"
               ,0x7a);
    std::__cxx11::string::~string((string *)local_30);
  }
  VariableSizeAllocationsManager::~VariableSizeAllocationsManager(&this->m_AllocationsMgr);
  return;
}

Assistant:

~MasterBlockListBasedManager()
    {
        DEV_CHECK_ERR(m_MasterBlockCounter == 0, m_MasterBlockCounter, " master block(s) have not been returned to the manager");
    }